

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong extraout_RAX;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  secp256k1_fe *psVar11;
  secp256k1_fe *psVar12;
  secp256k1_fe *a_00;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  uint64_t uVar13;
  secp256k1_fe c;
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  uint16_t t16 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe sStack_2c8;
  secp256k1_fe sStack_298;
  secp256k1_fe *psStack_268;
  secp256k1_fe sStack_240;
  secp256k1_fe sStack_210;
  uint64_t uStack_1e0;
  uint64_t uStack_1d8;
  uint64_t uStack_1d0;
  uint64_t uStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_fe local_1a8;
  ushort auStack_178 [16];
  uint16_t local_158 [16];
  uint16_t local_138 [16];
  ushort local_118 [16];
  ushort local_f8 [16];
  ushort local_d8 [16];
  uint16_t local_b8 [32];
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_1a8.n[0] = a->n[0];
  local_1a8.n[1] = a->n[1];
  local_1a8.n[2] = a->n[2];
  local_1a8.n[3] = a->n[3];
  local_1a8.n[4] = a->n[4];
  local_1a8.magnitude = a->magnitude;
  local_1a8.normalized = a->normalized;
  if (use_sqr == 0) {
    pcStack_1b0 = (code *)0x156bef;
    secp256k1_fe_mul(&local_1a8,&local_1a8,b);
  }
  else {
    pcStack_1b0 = (code *)0x156be5;
    secp256k1_fe_sqr(&local_1a8,&local_1a8);
  }
  local_48.n[0] = a->n[0];
  local_48.n[1] = a->n[1];
  local_48.n[2] = a->n[2];
  local_48.n[3] = a->n[3];
  local_48.n[4] = a->n[4];
  local_48.magnitude = a->magnitude;
  local_48.normalized = a->normalized;
  local_78.n[0] = b->n[0];
  local_78.n[1] = b->n[1];
  local_78.n[2] = b->n[2];
  local_78.n[3] = b->n[3];
  local_78.n[4] = b->n[4];
  local_78.magnitude = b->magnitude;
  local_78.normalized = b->normalized;
  pcStack_1b0 = (code *)0x156c3c;
  secp256k1_fe_normalize_var(&local_1a8);
  pcStack_1b0 = (code *)0x156c44;
  secp256k1_fe_normalize_var(&local_48);
  pcStack_1b0 = (code *)0x156c4c;
  secp256k1_fe_normalize_var(&local_78);
  pcStack_1b0 = (code *)0x156c5c;
  secp256k1_fe_get_b32((uchar *)local_d8,&local_48);
  pcStack_1b0 = (code *)0x156c6c;
  secp256k1_fe_get_b32((uchar *)local_f8,&local_78);
  pcStack_1b0 = (code *)0x156c7c;
  secp256k1_fe_get_b32((uchar *)local_118,&local_1a8);
  lVar7 = 0x10;
  lVar9 = 0;
  do {
    uVar3 = local_f8[lVar7 + -1];
    *(ushort *)((long)local_138 + lVar9) = local_d8[lVar7 + -1] << 8 | local_d8[lVar7 + -1] >> 8;
    uVar4 = local_118[lVar7 + -1];
    *(ushort *)((long)local_158 + lVar9) = uVar3 << 8 | uVar3 >> 8;
    *(ushort *)((long)auStack_178 + lVar9) = uVar4 << 8 | uVar4 >> 8;
    lVar9 = lVar9 + 2;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  pcStack_1b0 = (code *)0x156cdd;
  mulmod256(local_b8,local_138,local_158,test_fe_mul::m16);
  lVar7 = 0;
  uVar8 = extraout_RAX;
  do {
    uVar10 = uVar8 & 0xffffffff;
    bVar1 = *(byte *)((long)local_b8 + lVar7);
    psVar12 = (secp256k1_fe *)(ulong)bVar1;
    bVar2 = *(byte *)((long)auStack_178 + lVar7);
    a_00 = (secp256k1_fe *)(ulong)bVar2;
    uVar8 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar8 = uVar10;
    }
    iVar6 = (int)uVar8;
    if (bVar1 != bVar2) goto LAB_00156d05;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x20);
  iVar6 = 0;
LAB_00156d05:
  if (iVar6 == 0) {
    return;
  }
  pcStack_1b0 = test_sqrt;
  test_fe_mul_cold_1();
  r_00 = &sStack_240;
  psVar11 = &sStack_240;
  r = &sStack_210;
  psStack_1c0 = &local_78;
  psStack_1b8 = &local_48;
  pcStack_1b0 = (code *)&local_1a8;
  uVar5 = secp256k1_fe_sqrt(r,a_00);
  if (uVar5 == (psVar12 == (secp256k1_fe *)0x0)) {
    test_sqrt_cold_6();
LAB_00156ef8:
    test_sqrt_cold_5();
LAB_00156efd:
    test_sqrt_cold_4();
LAB_00156f02:
    r_00 = r;
    psVar11 = psVar12;
    test_sqrt_cold_3();
  }
  else {
    if (psVar12 == (secp256k1_fe *)0x0) {
      return;
    }
    secp256k1_fe_verify(&sStack_210);
    a_00 = (secp256k1_fe *)0x1;
    secp256k1_fe_verify_magnitude(&sStack_210,1);
    sStack_240.n[0] = 0x3ffffbfffff0bc - sStack_210.n[0];
    sStack_240.n[1] = 0x3ffffffffffffc - sStack_210.n[1];
    sStack_240.n[2] = 0x3ffffffffffffc - sStack_210.n[2];
    sStack_240.n[3] = 0x3ffffffffffffc - sStack_210.n[3];
    uVar13 = 0x3fffffffffffc - sStack_210.n[4];
    sStack_240.magnitude = 2;
    sStack_240.normalized = 0;
    sStack_240.n[4] = uVar13;
    uStack_1e0 = sStack_240.n[2];
    uStack_1d8 = sStack_240.n[3];
    uStack_1d0 = sStack_240.n[0];
    uStack_1c8 = sStack_240.n[1];
    secp256k1_fe_verify(&sStack_240);
    secp256k1_fe_verify(&sStack_210);
    r = psVar12;
    secp256k1_fe_verify(psVar12);
    iVar6 = psVar12->magnitude + sStack_210.magnitude;
    if (0x20 < iVar6) goto LAB_00156ef8;
    sStack_210.n[0] = psVar12->n[0] + sStack_210.n[0];
    sStack_210.n[1] = psVar12->n[1] + sStack_210.n[1];
    sStack_210.n[2] = psVar12->n[2] + sStack_210.n[2];
    sStack_210.n[3] = psVar12->n[3] + sStack_210.n[3];
    sStack_210.n[4] = sStack_210.n[4] + psVar12->n[4];
    sStack_210.normalized = 0;
    sStack_210.magnitude = iVar6;
    secp256k1_fe_verify(&sStack_210);
    secp256k1_fe_verify(&sStack_240);
    r = psVar12;
    secp256k1_fe_verify(psVar12);
    if (0x1e < psVar12->magnitude) goto LAB_00156efd;
    sStack_240.n[0] = psVar12->n[0] + uStack_1d0;
    sStack_240.n[1] = psVar12->n[1] + uStack_1c8;
    sStack_240.n[2] = psVar12->n[2] + uStack_1e0;
    sStack_240.n[3] = psVar12->n[3] + uStack_1d8;
    sStack_240.n[4] = uVar13 + psVar12->n[4];
    sStack_240.normalized = 0;
    sStack_240.magnitude = psVar12->magnitude + 2;
    secp256k1_fe_verify(&sStack_240);
    secp256k1_fe_normalize(&sStack_210);
    secp256k1_fe_normalize(&sStack_240);
    r = &sStack_210;
    secp256k1_fe_verify(&sStack_210);
    psVar12 = &sStack_210;
    if (sStack_210.normalized == 0) goto LAB_00156f02;
    if (((sStack_210.n[1] == 0 && sStack_210.n[3] == 0) &&
        (sStack_210.n[0] == 0 && sStack_210.n[2] == 0)) && sStack_210.n[4] == 0) {
      return;
    }
    secp256k1_fe_verify(&sStack_240);
    if (sStack_240.normalized != 0) {
      psVar11 = &sStack_240;
      if (((sStack_240.n[1] == 0 && sStack_240.n[3] == 0) &&
          (sStack_240.n[0] == 0 && sStack_240.n[2] == 0)) && sStack_240.n[4] == 0) {
        return;
      }
      goto LAB_00156f0c;
    }
  }
  test_sqrt_cold_2();
LAB_00156f0c:
  test_sqrt_cold_1();
  psVar12 = r_00 + 2;
  psStack_268 = psVar11;
  testutil_random_fe_non_zero_test(psVar12);
  secp256k1_fe_sqr(&sStack_298,psVar12);
  secp256k1_fe_mul(&sStack_2c8,&sStack_298,psVar12);
  secp256k1_fe_mul(r_00,a_00,&sStack_298);
  secp256k1_fe_mul(r_00 + 1,a_00 + 1,&sStack_2c8);
  *(int *)r_00[3].n = (int)a_00[2].n[0];
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}